

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

void __thiscall llvm::APInt::clearBit(APInt *this,uint BitPosition)

{
  byte bVar1;
  APInt *pAVar2;
  
  if (BitPosition <= this->BitWidth) {
    bVar1 = (byte)BitPosition & 0x3f;
    pAVar2 = (APInt *)((ulong)(BitPosition >> 3 & 0xfffffff8) + (long)(this->U).pVal);
    if (this->BitWidth < 0x41) {
      pAVar2 = this;
    }
    (pAVar2->U).VAL = (pAVar2->U).VAL & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    return;
  }
  __assert_fail("BitPosition <= BitWidth && \"BitPosition out of range\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                ,0x5b0,"void llvm::APInt::clearBit(unsigned int)");
}

Assistant:

void clearBit(unsigned BitPosition) {
    assert(BitPosition <= BitWidth && "BitPosition out of range");
    WordType Mask = ~maskBit(BitPosition);
    if (isSingleWord())
      U.VAL &= Mask;
    else
      U.pVal[whichWord(BitPosition)] &= Mask;
  }